

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O2

void __thiscall cmGlobalGenerator::DirectoryContent::DirectoryContent(DirectoryContent *this)

{
  _Rb_tree_header *p_Var1;
  
  this->LastDiskTime = -1;
  p_Var1 = &(this->All)._M_t._M_impl.super__Rb_tree_header;
  (this->All)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->All)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->All)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->All)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->All)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->Generated)._M_t._M_impl.super__Rb_tree_header;
  (this->Generated)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Generated)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Generated)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Generated)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Generated)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

DirectoryContent()
      : LastDiskTime(-1)
    {
    }